

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::AddressTest_AddressFromSockaddr_Ipv6SocketAddress_Test::TestBody
          (AddressTest_AddressFromSockaddr_Ipv6SocketAddress_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_170;
  Message local_168;
  string local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_110;
  Message local_108;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Message local_98;
  ErrorCode local_90 [4];
  Error local_80;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  sockaddr_in6 sockaddr;
  Address addr;
  AddressTest_AddressFromSockaddr_Ipv6SocketAddress_Test *this_local;
  
  Address::Address((Address *)&sockaddr.sin6_scope_id);
  sockaddr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xa;
  sockaddr._0_4_ = SUB84(_in6addr_loopback,0);
  sockaddr.sin6_flowinfo = (uint32_t)((ulong)_in6addr_loopback >> 0x20);
  sockaddr.sin6_addr.__in6_u.__u6_addr32[0] = (uint32_t)___throw_bad_array_new_length;
  sockaddr.sin6_addr.__in6_u.__u6_addr32[1] =
       (uint32_t)((ulong)___throw_bad_array_new_length >> 0x20);
  uVar2 = htons(0x1634);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._2_2_ = uVar2;
  Address::Set(&local_80,(Address *)&sockaddr.sin6_scope_id,(sockaddr_storage *)&gtest_ar.message_);
  local_90[0] = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_58,"addr.Set(*reinterpret_cast<sockaddr_storage *>(&sockaddr))",
             "ErrorCode::kNone",&local_80,local_90);
  Error::~Error(&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_b1 = Address::IsValid((Address *)&sockaddr.sin6_scope_id);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b0,
               (AssertionResult *)"addr.IsValid()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_f9 = Address::IsIpv6((Address *)&sockaddr.sin6_scope_id);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_f8,
               (AssertionResult *)"addr.IsIpv6()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  Address::ToString_abi_cxx11_(&local_160,(Address *)&sockaddr.sin6_scope_id);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_140,"addr.ToString()","\"::1\"",&local_160,(char (*) [4])"::1");
  std::__cxx11::string::~string((string *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  Address::~Address((Address *)&sockaddr.sin6_scope_id);
  return;
}

Assistant:

TEST(AddressTest, AddressFromSockaddr_Ipv6SocketAddress)
{
    Address      addr;
    sockaddr_in6 sockaddr;
    memset(&sockaddr, 0, sizeof(sockaddr));
    sockaddr.sin6_family = AF_INET6;
    sockaddr.sin6_addr   = in6addr_loopback;
    sockaddr.sin6_port   = htons(5684);

    EXPECT_EQ(addr.Set(*reinterpret_cast<sockaddr_storage *>(&sockaddr)), ErrorCode::kNone);
    EXPECT_TRUE(addr.IsValid());
    EXPECT_TRUE(addr.IsIpv6());

    EXPECT_EQ(addr.ToString(), "::1");
}